

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

index __thiscall merlin::graph::add_node(graph *this)

{
  _Elt_pointer puVar1;
  index iVar2;
  
  puVar1 = (this->m_vvacant).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar1 == (this->m_vvacant).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>
                ._M_impl.super__Deque_impl_data._M_start._M_cur) {
    iVar2 = (long)(this->m_adj).
                  super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->m_adj).
                  super__Vector_base<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 5;
    std::vector<merlin::my_set<merlin::edge_id>,_std::allocator<merlin::my_set<merlin::edge_id>_>_>
    ::resize(&this->m_adj,iVar2 + 1);
  }
  else {
    if (puVar1 == (this->m_vvacant).c.
                  super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      puVar1 = (this->m_vvacant).c.super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    iVar2 = puVar1[-1];
    std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_back(&(this->m_vvacant).c);
  }
  return iVar2;
}

Assistant:

const edge_id& edge(index eij) const {
		return m_edges[eij];
	}